

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

JavascriptArray * __thiscall
Js::NumberFormatPartsBuilder::ToPartsArray(NumberFormatPartsBuilder *this)

{
  UNumberFormatFields UVar1;
  char16_t *pcVar2;
  code *pcVar3;
  bool bVar4;
  ScriptContext *pSVar5;
  JavascriptLibrary *pJVar6;
  JavascriptArray *pJVar7;
  UNumberFormatFields **ppUVar8;
  undefined4 *puVar9;
  JavascriptString *newValue;
  char16_t **ppcVar10;
  ScriptContext **ppSVar11;
  JavascriptString *newValue_00;
  DynamicObject *instance;
  DynamicObject *part;
  JavascriptString *partValue;
  JavascriptString *partType;
  uint local_20;
  charcount_t end;
  charcount_t start;
  int retIndex;
  JavascriptArray *ret;
  NumberFormatPartsBuilder *this_local;
  
  pSVar5 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->sc);
  pJVar6 = ScriptContext::GetLibrary(pSVar5);
  pJVar7 = JavascriptLibrary::CreateArray(pJVar6,0);
  end = 0;
  local_20 = 0;
  do {
    if (this->formattedLength <= local_20) {
      return pJVar7;
    }
    partType._4_4_ = local_20;
    if (local_20 != 0) {
      ppUVar8 = Memory::WriteBarrierPtr::operator_cast_to_UNumberFormatFields__
                          ((WriteBarrierPtr *)&this->fields);
      UVar1 = (*ppUVar8)[local_20 - 1];
      ppUVar8 = Memory::WriteBarrierPtr::operator_cast_to_UNumberFormatFields__
                          ((WriteBarrierPtr *)&this->fields);
      if (UVar1 == (*ppUVar8)[local_20]) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x93d,"(start == 0 || fields[start - 1] != fields[start])",
                                    "start == 0 || fields[start - 1] != fields[start]");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
    }
    do {
      partType._4_4_ = partType._4_4_ + 1;
      bVar4 = false;
      if (partType._4_4_ < this->formattedLength) {
        ppUVar8 = Memory::WriteBarrierPtr::operator_cast_to_UNumberFormatFields__
                            ((WriteBarrierPtr *)&this->fields);
        UVar1 = (*ppUVar8)[partType._4_4_];
        ppUVar8 = Memory::WriteBarrierPtr::operator_cast_to_UNumberFormatFields__
                            ((WriteBarrierPtr *)&this->fields);
        bVar4 = UVar1 == (*ppUVar8)[local_20];
      }
    } while (bVar4);
    ppUVar8 = Memory::WriteBarrierPtr::operator_cast_to_UNumberFormatFields__
                        ((WriteBarrierPtr *)&this->fields);
    newValue = GetPartTypeString(this,(*ppUVar8)[local_20]);
    ppcVar10 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                         ((WriteBarrierPtr *)&this->formatted);
    pcVar2 = *ppcVar10;
    ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                         ((WriteBarrierPtr *)&this->sc);
    newValue_00 = JavascriptString::NewCopyBuffer
                            (pcVar2 + local_20,partType._4_4_ - local_20,*ppSVar11);
    pSVar5 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->sc);
    pJVar6 = ScriptContext::GetLibrary(pSVar5);
    instance = JavascriptLibrary::CreateObject(pJVar6,false,0);
    Js::JavascriptOperators::InitProperty
              (&instance->super_RecyclableObject,0xf6,newValue,PropertyOperation_None);
    Js::JavascriptOperators::InitProperty
              (&instance->super_RecyclableObject,0x197,newValue_00,PropertyOperation_None);
    (*(pJVar7->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar7,(ulong)end,instance,0);
    local_20 = partType._4_4_;
    end = end + 1;
  } while( true );
}

Assistant:

JavascriptArray *ToPartsArray()
        {
            JavascriptArray *ret = sc->GetLibrary()->CreateArray(0);
            int retIndex = 0;

            // With the structure of the fields array, creating the resulting parts list to return to JS is simple
            // Map set parts to the corresponding `type` value (see ECMA-402 #sec-partitionnumberpattern), and unset parts to the `literal` type
            for (charcount_t start = 0; start < formattedLength; ++retIndex)
            {
                // At the top of the loop, fields[start] should always be different from fields[start - 1] (we should be at the start of a new part),
                // since start is adjusted later in the loop to the end of the part
                AssertOrFailFast(start == 0 || fields[start - 1] != fields[start]);

                charcount_t end = start + 1;
                while (end < formattedLength && fields[end] == fields[start])
                {
                    ++end;
                }

                JavascriptString *partType = GetPartTypeString(fields[start]);
                JavascriptString *partValue = JavascriptString::NewCopyBuffer(formatted + start, end - start, sc);

                DynamicObject* part = sc->GetLibrary()->CreateObject();
                JavascriptOperators::InitProperty(part, PropertyIds::type, partType);
                JavascriptOperators::InitProperty(part, PropertyIds::value, partValue);

                ret->SetItem(retIndex, part, PropertyOperationFlags::PropertyOperation_None);

                start = end;
            }

            return ret;
        }